

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O0

llama_pos __thiscall
llama_kv_cache_unified::seq_pos_max(llama_kv_cache_unified *this,llama_seq_id seq_id)

{
  bool bVar1;
  const_reference __b;
  int *piVar2;
  undefined4 in_ESI;
  long in_RDI;
  uint32_t i;
  llama_pos result;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar3;
  llama_pos lVar4;
  
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < *(uint *)(in_RDI + 0x6c); uVar3 = uVar3 + 1) {
    std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
              ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0x78),(ulong)uVar3
              );
    bVar1 = llama_kv_cell::has_seq_id
                      ((llama_kv_cell *)CONCAT44(in_ESI,lVar4),
                       (llama_seq_id *)CONCAT44(uVar3,in_stack_ffffffffffffffe8));
    if (bVar1) {
      __b = std::vector<llama_kv_cell,_std::allocator<llama_kv_cell>_>::operator[]
                      ((vector<llama_kv_cell,_std::allocator<llama_kv_cell>_> *)(in_RDI + 0x78),
                       (ulong)uVar3);
      piVar2 = std::max<int>((int *)&stack0xfffffffffffffff0,&__b->pos);
      lVar4 = *piVar2;
    }
  }
  return lVar4;
}

Assistant:

llama_pos llama_kv_cache_unified::seq_pos_max(llama_seq_id seq_id) const {
    llama_pos result = 0;

    for (uint32_t i = 0; i < size; ++i) {
        if (cells[i].has_seq_id(seq_id)) {
            result = std::max(result, cells[i].pos);
        }
    }

    return result;
}